

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTableCell::selectCell(QAccessibleTableCell *this)

{
  SelectionMode SVar1;
  SelectionBehavior SVar2;
  undefined4 uVar3;
  ulong uVar4;
  QAccessibleTableInterface *pQVar5;
  QItemSelectionModel *pQVar6;
  long *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableInterface *cellTable;
  SelectionMode selectionMode;
  QAbstractItemView *in_stack_ffffffffffffffa0;
  undefined4 local_24;
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar4 & 1) != 0) {
    QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f4d42);
    SVar1 = QAbstractItemView::selectionMode(in_stack_ffffffffffffffa0);
    if (SVar1 != NoSelection) {
      (**(code **)(*in_RDI + 0xe0))();
      pQVar5 = QAccessibleInterface::tableInterface((QAccessibleInterface *)0x7f4d73);
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f4d86);
      SVar2 = QAbstractItemView::selectionBehavior(in_stack_ffffffffffffffa0);
      if (SVar2 != SelectItems) {
        if (SVar2 == SelectRows) {
          if (pQVar5 != (QAccessibleTableInterface *)0x0) {
            uVar3 = QPersistentModelIndex::row();
            (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,uVar3);
          }
          goto LAB_007f4e85;
        }
        if (SVar2 == SelectColumns) {
          if (pQVar5 != (QAccessibleTableInterface *)0x0) {
            uVar3 = QPersistentModelIndex::column();
            (**(code **)(*(long *)pQVar5 + 0x90))(pQVar5,uVar3);
          }
          goto LAB_007f4e85;
        }
      }
      if (SVar1 == SingleSelection) {
        QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f4e2e);
        QAbstractItemView::clearSelection(in_stack_ffffffffffffffa0);
      }
      QPointer<QAbstractItemView>::operator->((QPointer<QAbstractItemView> *)0x7f4e44);
      pQVar6 = QAbstractItemView::selectionModel(in_stack_ffffffffffffffa0);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffffa0,
                 (SelectionFlag)((ulong)pQVar6 >> 0x20));
      (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,local_20,local_24);
    }
  }
LAB_007f4e85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTableCell::selectCell()
{
    if (!isValid())
        return;
    QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;
    Q_ASSERT(table());
    QAccessibleTableInterface *cellTable = table()->tableInterface();

    switch (view->selectionBehavior()) {
    case QAbstractItemView::SelectItems:
        break;
    case QAbstractItemView::SelectColumns:
        if (cellTable)
            cellTable->selectColumn(m_index.column());
        return;
    case QAbstractItemView::SelectRows:
        if (cellTable)
            cellTable->selectRow(m_index.row());
        return;
    }

    if (selectionMode == QAbstractItemView::SingleSelection) {
        view->clearSelection();
    }

    view->selectionModel()->select(m_index, QItemSelectionModel::Select);
}